

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool __thiscall
leveldb::VersionSet::Builder::BySmallestKey::operator()
          (BySmallestKey *this,FileMetaData *f1,FileMetaData *f2)

{
  size_type sVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  pointer local_28;
  size_type local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (f1->smallest).rep_._M_string_length;
  if (sVar1 != 0) {
    local_28 = (f1->smallest).rep_._M_dataplus._M_p;
    local_20 = sVar1;
    if ((f2->smallest).rep_._M_string_length != 0) {
      iVar2 = (*(this->internal_comparator->super_Comparator)._vptr_Comparator[2])
                        (this->internal_comparator,&local_28);
      if (iVar2 == 0) {
        bVar3 = f1->number < f2->number;
      }
      else {
        bVar3 = SUB41((uint)iVar2 >> 0x1f,0);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return bVar3;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("!rep_.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                ,0x96,"Slice leveldb::InternalKey::Encode() const");
}

Assistant:

bool operator()(FileMetaData* f1, FileMetaData* f2) const {
      int r = internal_comparator->Compare(f1->smallest, f2->smallest);
      if (r != 0) {
        return (r < 0);
      } else {
        // Break ties by file number
        return (f1->number < f2->number);
      }
    }